

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * __thiscall
capnp::Orphan<capnp::DynamicValue>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  uint16_t uVar2;
  size_t sVar3;
  RawBrandedSchema *pRVar4;
  char *pcVar5;
  SegmentBuilder *pSVar6;
  CapTableBuilder *pCVar7;
  StructPointerCount SVar8;
  undefined1 uVar9;
  ListElementCount LVar10;
  BitsPerElementN<23> BVar11;
  ElementSize EVar12;
  uint uVar13;
  int64_t iVar14;
  Which elementType;
  uint uVar15;
  ListBuilder *__return_storage_ptr___00;
  ArrayPtr<unsigned_char> AVar16;
  Fault f;
  Schema local_f0;
  Reader local_e8;
  Builder local_b8;
  StructBuilder local_a0;
  ListBuilder local_78;
  ListBuilder local_50;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar14 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_001c6fed;
  case UINT:
    iVar14 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_001c6fed:
    (__return_storage_ptr__->field_1).intValue = iVar14;
    break;
  case FLOAT:
    iVar14 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar14;
    break;
  case TEXT:
    capnp::_::OrphanBuilder::asText(&local_b8,&this->builder);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b8.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_b8._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_b8.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    AVar16 = (ArrayPtr<unsigned_char>)capnp::_::OrphanBuilder::asData(&this->builder);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar16;
    break;
  case LIST:
    iVar14 = (this->field_1).intValue;
    pcVar5 = *(char **)((long)&this->field_1 + 8);
    if (((this->field_1).field9[2] == '\0') &&
       ((this->field_1).listSchema.elementType.baseType == STRUCT)) {
      local_f0.raw = (RawBrandedSchema *)Type::asStruct((Type *)&(this->field_1).enumValue);
      Schema::getProto(&local_e8,&local_f0);
      uVar15 = 0;
      uVar13 = 0;
      if (0x7f < local_e8._reader.dataSize) {
        uVar13 = (uint)*(ushort *)
                        ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                                super_CapTableReader)._vptr_CapTableReader + 6);
      }
      if (0xcf < local_e8._reader.dataSize) {
        uVar15 = (uint)*(ushort *)
                        &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                         super_CapTableReader)._vptr_CapTableReader << 0x10;
      }
      __return_storage_ptr___00 = &local_50;
      capnp::_::OrphanBuilder::asStructList
                (__return_storage_ptr___00,&this->builder,(StructSize)(uVar15 | uVar13));
    }
    else {
      elementType = LIST;
      if ((this->field_1).field9[2] == '\0') {
        elementType = (this->field_1).listSchema.elementType.baseType;
      }
      EVar12 = anon_unknown_71::elementSizeFor(elementType);
      __return_storage_ptr___00 = &local_78;
      capnp::_::OrphanBuilder::asList(__return_storage_ptr___00,&this->builder,EVar12);
    }
    SVar8 = __return_storage_ptr___00->structPointerCount;
    EVar12 = __return_storage_ptr___00->elementSize;
    uVar9 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar8;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar12;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar9;
    pSVar6 = __return_storage_ptr___00->segment;
    pCVar7 = __return_storage_ptr___00->capTable;
    LVar10 = __return_storage_ptr___00->elementCount;
    BVar11 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar10;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar11;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar6;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar7;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).intValue = iVar14;
    (__return_storage_ptr__->field_1).textValue.content.ptr = pcVar5;
    break;
  case ENUM:
    iVar14 = (this->field_1).intValue;
    uVar2 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar14;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    pRVar4 = (RawBrandedSchema *)(this->field_1).intValue;
    local_f0.raw = pRVar4;
    Schema::getProto(&local_e8,&local_f0);
    uVar15 = 0;
    uVar13 = 0;
    if (0x7f < local_e8._reader.dataSize) {
      uVar13 = (uint)*(ushort *)
                      ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                              super_CapTableReader)._vptr_CapTableReader + 6);
    }
    if (0xcf < local_e8._reader.dataSize) {
      uVar15 = (uint)*(ushort *)
                      &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                       super_CapTableReader)._vptr_CapTableReader << 0x10;
    }
    capnp::_::OrphanBuilder::asStruct(&local_a0,&this->builder,(StructSize)(uVar15 | uVar13));
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a0._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a0.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a0.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a0.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a0.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pRVar4;
    break;
  case CAPABILITY:
    sVar3 = (this->field_1).intValue;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_e8);
    __return_storage_ptr__->type = CAPABILITY;
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_e8._reader.segment._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_e8._reader.segment._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_e8._reader.capTable._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_e8._reader.capTable._4_4_;
    (__return_storage_ptr__->field_1).textValue.content.size_ = sVar3;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x840,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder Orphan<DynamicValue>::get() {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asText();
    case DynamicValue::DATA: return builder.asData();
    case DynamicValue::LIST:
      if (listSchema.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(listSchema,
            builder.asStructList(structSizeFromSchema(listSchema.getStructElementType())));
      } else {
        return DynamicList::Builder(listSchema,
            builder.asList(elementSizeFor(listSchema.whichElementType())));
      }
    case DynamicValue::STRUCT:
      return DynamicStruct::Builder(structSchema,
          builder.asStruct(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_REQUIRE("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                      "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}